

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall
soul::ResolutionPass::tryPass<soul::ResolutionPass::ConstantFolder>
          (ResolutionPass *this,RunStats *runStats,bool ignoreErrors)

{
  ConstantFolder pass;
  ErrorIgnoringRewritingASTVisitor EStack_48;
  
  ConstantFolder::ConstantFolder((ConstantFolder *)&EStack_48,this,ignoreErrors);
  ErrorIgnoringRewritingASTVisitor::performPass(&EStack_48);
  runStats->numFailures = runStats->numFailures + EStack_48.numFails;
  runStats->numReplaced = runStats->numReplaced + EStack_48.super_RewritingASTVisitor.itemsReplaced;
  return;
}

Assistant:

void tryPass (RunStats& runStats, bool ignoreErrors)
    {
        PassType pass (*this, ignoreErrors);
        pass.performPass();
        runStats.numFailures += pass.numFails;
        runStats.numReplaced += pass.itemsReplaced;
    }